

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniSSC.cpp
# Opt level: O0

void * MiniSSCThread(void *pParam)

{
  double urt;
  double ult;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char local_898 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_690;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  double thrust2;
  double thrust1;
  MINISSC minissc;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_690 = 0;
  minissc.MaxAngle = (double)pParam;
  memset(&thrust1,0,0x618);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseMiniSSC == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("MiniSSC paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectMiniSSC((MINISSC *)&thrust1);
      }
      if (bExit != 0) goto LAB_001cec3e;
      mSleep(100);
    }
    if (bRestartMiniSSC != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a MiniSSC.\n");
        chrono_period._68_4_ = 0;
        DisconnectMiniSSC((MINISSC *)&thrust1);
      }
      bRestartMiniSSC = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectMiniSSC((MINISSC *)&thrust1,"MiniSSC0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = minissc.BaudRate;
        if (minissc.RS232Port._784_8_ != 0) {
          fclose((FILE *)minissc.RS232Port._784_8_);
          minissc.RS232Port.DevType = 0;
          minissc.RS232Port._788_4_ = 0;
        }
        if ((minissc.timeout != 0) && (minissc.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)(minissc.LastPWs + 3));
          if (sVar2 == 0) {
            sprintf(local_898,"minissc");
          }
          else {
            sprintf(local_898,"%.127s",minissc.LastPWs + 3);
          }
          sVar2 = strlen(local_898);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_898[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_898), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_898);
            memset(local_898 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_898,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          minissc.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)minissc.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create MiniSSC data file.\n");
            goto LAB_001cec3e;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      EnterCriticalSection(&StateVariablesCS);
      ult = u2;
      urt = u1;
      LeaveCriticalSection(&StateVariablesCS);
      iVar1 = SetThrustersMiniSSC((MINISSC *)&thrust1,urt,ult);
      if (iVar1 != 0) {
        printf("Connection to a MiniSSC lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectMiniSSC((MINISSC *)&thrust1);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_690 = local_690 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_690)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001cec3e:
      SetThrustersMiniSSC((MINISSC *)&thrust1,0.0,0.0);
      mSleep(0x32);
      StopChronoQuick((CHRONO *)&errcount);
      if (minissc.RS232Port._784_8_ != 0) {
        fclose((FILE *)minissc.RS232Port._784_8_);
        minissc.RS232Port.DevType = 0;
        minissc.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectMiniSSC((MINISSC *)&thrust1);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MiniSSCThread(void* pParam)
{
	MINISSC minissc;
	//double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&minissc, 0, sizeof(MINISSC));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMiniSSC) 
		{
			if (bConnected)
			{
				printf("MiniSSC paused.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMiniSSC) 
		{
			if (bConnected)
			{
				printf("Restarting a MiniSSC.\n");
				bConnected = FALSE;
				DisconnectMiniSSC(&minissc);
			}
			bRestartMiniSSC = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMiniSSC(&minissc, "MiniSSC0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = minissc.threadperiod;

				if (minissc.pfSaveFile != NULL)
				{
					fclose(minissc.pfSaveFile); 
					minissc.pfSaveFile = NULL;
				}
				if ((minissc.bSaveRawData)&&(minissc.pfSaveFile == NULL)) 
				{
					if (strlen(minissc.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", minissc.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "minissc");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					minissc.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (minissc.pfSaveFile == NULL) 
					{
						printf("Unable to create MiniSSC data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUBBLE_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersMiniSSC(&minissc, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a MiniSSC lost.\n");
					bConnected = FALSE;
					DisconnectMiniSSC(&minissc);
					break;
				}
				break;
			}
		}

		//printf("MiniSSCThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	default:
		SetThrustersMiniSSC(&minissc, 0, 0);
		mSleep(50);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (minissc.pfSaveFile != NULL)
	{
		fclose(minissc.pfSaveFile); 
		minissc.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMiniSSC(&minissc);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}